

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O3

bool asio::detail::
     reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
     ::do_perform(reactor_op *base)

{
  bool bVar1;
  size_t addr_len;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  
  bufs.buffer_.iov_base = base[1].super_operation.func_;
  bufs.buffer_.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  addr_len = 0x1c;
  bufs.total_buffer_size_ = bufs.buffer_.iov_len;
  bVar1 = socket_ops::non_blocking_recvfrom
                    (*(socket_type *)&base[1].super_operation.next_,&bufs.buffer_,1,
                     *(int *)&base[1].ec_._M_cat,*(socket_addr_type **)&base[1].ec_,&addr_len,
                     &base->ec_,&base->bytes_transferred_);
  if ((bVar1) && ((base->ec_)._M_value == 0)) {
    ip::basic_endpoint<asio::ip::udp>::resize
              (*(basic_endpoint<asio::ip::udp> **)&base[1].ec_,addr_len);
  }
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_recvfrom_op_base* o(
        static_cast<reactive_socket_recvfrom_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    std::size_t addr_len = o->sender_endpoint_.capacity();
    bool result = socket_ops::non_blocking_recvfrom(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        o->sender_endpoint_.data(), &addr_len,
        o->ec_, o->bytes_transferred_);

    if (result && !o->ec_)
      o->sender_endpoint_.resize(addr_len);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recvfrom",
          o->ec_, o->bytes_transferred_));

    return result;
  }